

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.cpp
# Opt level: O1

void __thiscall so_5::environment_t::impl__run_layers_and_go_further(environment_t *this)

{
  undefined1 *local_90 [2];
  undefined1 local_80 [80];
  
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"run_layers","");
  impl::layer_core_t::start
            (&((this->m_impl)._M_t.
               super___uniq_ptr_impl<so_5::environment_t::internals_t,_std::default_delete<so_5::environment_t::internals_t>_>
               ._M_t.
               super__Tuple_impl<0UL,_so_5::environment_t::internals_t_*,_std::default_delete<so_5::environment_t::internals_t>_>
               .super__Head_base<0UL,_so_5::environment_t::internals_t_*,_false>._M_head_impl)->
              m_layer_core);
  impl__run_dispatcher_and_go_further(this);
  impl::layer_core_t::finish
            (&((this->m_impl)._M_t.
               super___uniq_ptr_impl<so_5::environment_t::internals_t,_std::default_delete<so_5::environment_t::internals_t>_>
               ._M_t.
               super__Tuple_impl<0UL,_so_5::environment_t::internals_t_*,_std::default_delete<so_5::environment_t::internals_t>_>
               .super__Head_base<0UL,_so_5::environment_t::internals_t_*,_false>._M_head_impl)->
              m_layer_core);
  if (local_90[0] != local_80) {
    operator_delete(local_90[0]);
  }
  return;
}

Assistant:

void
environment_t::impl__run_layers_and_go_further()
{
	impl::run_stage(
			"run_layers",
			[this] { m_impl->m_layer_core.start(); },
			[this] { m_impl->m_layer_core.finish(); },
			[this] { impl__run_dispatcher_and_go_further(); } );
}